

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_envelope_eval.cxx
# Opt level: O3

float incoming(xr_key *key0,xr_key *key1,xr_key *key1_next)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = 0.0;
  switch(key1->shape) {
  case '\0':
    fVar3 = 1.0 - key1->tension;
    fVar1 = (key1->bias + 1.0) * (1.0 - key1->continuity) * fVar3;
    fVar2 = key1->value - key0->value;
    if (key1_next != (xr_key *)0x0) {
      return (fVar1 * fVar2 +
             (key1_next->value - key1->value) *
             (1.0 - key1->bias) * fVar3 * (key1->continuity + 1.0)) *
             ((key1->time - key0->time) / (key1_next->time - key0->time));
    }
    return fVar1 * fVar2;
  case '\x01':
  case '\x02':
    fVar1 = key1->param[0];
    if (key1_next != (xr_key *)0x0) {
      return fVar1 * ((key1->time - key0->time) / (key1_next->time - key0->time));
    }
    break;
  case '\x03':
    fVar1 = key1->value - key0->value;
    if (key1_next != (xr_key *)0x0) {
      return (fVar1 + (key1_next->value - key1->value)) *
             ((key1->time - key0->time) / (key1_next->time - key0->time));
    }
    break;
  case '\x05':
    fVar1 = (key1->time - key0->time) * key1->param[1];
    if (1e-05 < ABS(key1->param[0])) {
      return fVar1 / key1->param[0];
    }
    fVar1 = fVar1 * 100000.0;
  }
  return fVar1;
}

Assistant:

static float incoming(const xr_key* key0, const xr_key* key1, const xr_key* key1_next)
{
	float a, b, d, t, in;
	switch (key1->shape) {
	case xr_key::SHAPE_LINE:
		d = key1->value - key0->value;
		if (key1_next) {
			t = (key1->time - key0->time)/(key1_next->time - key0->time);
			in = t*(key1_next->value - key1->value + d);
		} else {
			in = d;
		}
		break;

	case xr_key::SHAPE_TCB:
		a = (1.f - key1->tension)*(1.f - key1->continuity)*(1.f + key1->bias);
		b = (1.f - key1->tension)*(1.f + key1->continuity)*(1.f - key1->bias);
		d = key1->value - key0->value;
		if (key1_next) {
			t = (key1->time - key0->time)/(key1_next->time - key0->time);
			in = t*(b*(key1_next->value - key1->value) + a*d);
		} else {
			in = a*d;
		}
		break;

	case xr_key::SHAPE_BEZI:
	case xr_key::SHAPE_HERM:
		in = key1->param[0];
		if (key1_next)
			in *= (key1->time - key0->time)/(key1_next->time - key0->time);
		break;

	case xr_key::SHAPE_BEZ2:
		in = key1->param[1]*(key1->time - key0->time);
		if (std::abs(key1->param[0]) > 1e-5f)
			in /= key1->param[0];
		else
			in *= 1e+5f;
		break;

	case xr_key::SHAPE_STEP:
	default:
		in = 0.f;
		break;
	}
	return in;
}